

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O1

int Curl_cert_hostcheck(char *match_pattern,char *hostname)

{
  int iVar1;
  char *__s;
  char *__s_00;
  size_t sVar2;
  char *pcVar3;
  char *first;
  char *pcVar4;
  uint uVar5;
  size_t max;
  bool bVar6;
  in_addr ignored;
  undefined1 local_50 [12];
  undefined1 local_44 [20];
  
  if (match_pattern == (char *)0x0) {
    return 0;
  }
  if (hostname == (char *)0x0) {
    return 0;
  }
  if (*match_pattern == '\0') {
    return 0;
  }
  if (*hostname == '\0') {
    return 0;
  }
  __s = (*Curl_cstrdup)(match_pattern);
  if (__s == (char *)0x0) {
    return 0;
  }
  __s_00 = (*Curl_cstrdup)(hostname);
  if (__s_00 == (char *)0x0) {
    uVar5 = 0;
    goto LAB_0013acf3;
  }
  sVar2 = strlen(__s_00);
  if (__s_00[sVar2 - 1] == '.') {
    __s_00[sVar2 - 1] = '\0';
  }
  sVar2 = strlen(__s);
  if (__s[sVar2 - 1] == '.') {
    __s[sVar2 - 1] = '\0';
  }
  pcVar3 = strchr(__s,0x2a);
  if (pcVar3 == (char *)0x0) {
LAB_0013acd4:
    iVar1 = Curl_strcasecompare(__s,__s_00);
LAB_0013acdf:
    bVar6 = iVar1 != 0;
  }
  else {
    iVar1 = inet_pton(2,__s_00,local_50);
    if ((iVar1 < 1) && (iVar1 = inet_pton(10,__s_00,local_44), iVar1 < 1)) {
      first = strchr(__s,0x2e);
      if ((first == (char *)0x0) ||
         (((pcVar4 = strchr(first + 1,0x2e), first < pcVar3 || (pcVar4 == (char *)0x0)) ||
          (iVar1 = Curl_strncasecompare(__s,"xn--",4), iVar1 != 0)))) goto LAB_0013acd4;
      pcVar4 = strchr(__s_00,0x2e);
      if (((pcVar4 == (char *)0x0) || (iVar1 = Curl_strcasecompare(first,pcVar4), iVar1 == 0)) ||
         (((long)pcVar4 - (long)__s_00 < (long)first - (long)__s ||
          (iVar1 = Curl_strncasecompare(__s,__s_00,(long)pcVar3 - (long)__s), iVar1 == 0))))
      goto LAB_0013ac87;
      max = (long)first - (long)(pcVar3 + 1);
      iVar1 = Curl_strncasecompare(pcVar3 + 1,pcVar4 + -max,max);
      goto LAB_0013acdf;
    }
LAB_0013ac87:
    bVar6 = false;
  }
  uVar5 = (uint)bVar6;
  (*Curl_cfree)(__s_00);
LAB_0013acf3:
  (*Curl_cfree)(__s);
  return uVar5;
}

Assistant:

int Curl_cert_hostcheck(const char *match_pattern, const char *hostname)
{
  char *matchp;
  char *hostp;
  int res = 0;
  if(!match_pattern || !*match_pattern ||
      !hostname || !*hostname) /* sanity check */
    ;
  else {
    matchp = strdup(match_pattern);
    if(matchp) {
      hostp = strdup(hostname);
      if(hostp) {
        if(hostmatch(hostp, matchp) == CURL_HOST_MATCH)
          res = 1;
        free(hostp);
      }
      free(matchp);
    }
  }

  return res;
}